

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adaptivescannero1.cpp
# Opt level: O0

void __thiscall
AdaptiveScannerO1::AdaptiveScannerO1
          (AdaptiveScannerO1 *this,int xmin,int ymin,int xmax,int ymax,int a,int b,int nbs,
          bool *steps,int cx,int cy,int length)

{
  int iVar1;
  int local_34;
  bool *pbStack_30;
  int i;
  bool *st;
  int w_2;
  int a_local;
  int ymax_local;
  int xmax_local;
  int ymin_local;
  int xmin_local;
  AdaptiveScannerO1 *this_local;
  
  DirectionalScanner::DirectionalScanner
            (&this->super_DirectionalScanner,xmin,ymin,xmax,ymax,nbs,steps,cx,cy);
  (this->super_DirectionalScanner)._vptr_DirectionalScanner =
       (_func_int **)&PTR__AdaptiveScannerO1_001b7458;
  (this->super_DirectionalScanner).dla = a;
  (this->super_DirectionalScanner).dlb = b;
  (this->super_DirectionalScanner).fs = steps + nbs;
  st._0_4_ = (length + 1) / 2;
  pbStack_30 = steps + nbs;
  for (local_34 = 0; local_34 < (int)st; local_34 = local_34 + 1) {
    pbStack_30 = pbStack_30 + -1;
    if (pbStack_30 < steps) {
      pbStack_30 = steps + (long)nbs + -1;
    }
    if ((*pbStack_30 & 1U) != 0) {
      (this->super_DirectionalScanner).lcx = (this->super_DirectionalScanner).lcx + 1;
    }
    (this->super_DirectionalScanner).lcy = (this->super_DirectionalScanner).lcy + -1;
  }
  this->dlc1 = (this->super_DirectionalScanner).dla * (this->super_DirectionalScanner).lcx +
               (this->super_DirectionalScanner).dlb * (this->super_DirectionalScanner).lcy;
  (this->super_DirectionalScanner).lst2 = pbStack_30;
  (this->super_DirectionalScanner).rst2 = pbStack_30;
  pbStack_30 = steps;
  while (iVar1 = (int)st + -1, 0 < (int)st) {
    if ((*pbStack_30 & 1U) != 0) {
      cx = cx + -1;
    }
    cy = cy + 1;
    pbStack_30 = pbStack_30 + 1;
    st._0_4_ = iVar1;
    if ((this->super_DirectionalScanner).fs <= pbStack_30) {
      pbStack_30 = steps;
    }
  }
  (this->super_DirectionalScanner).dlc2 =
       (this->super_DirectionalScanner).dla * cx + (this->super_DirectionalScanner).dlb * cy;
  *(int *)&(this->super_DirectionalScanner).field_0x64 = a;
  this->templ_b = b;
  this->templ_nu = this->dlc1 - (this->super_DirectionalScanner).dlc2;
  (this->super_DirectionalScanner).rcx = (this->super_DirectionalScanner).lcx;
  (this->super_DirectionalScanner).rcy = (this->super_DirectionalScanner).lcy;
  return;
}

Assistant:

AdaptiveScannerO1::AdaptiveScannerO1 (
                          int xmin, int ymin, int xmax, int ymax,
                          int a, int b,
                          int nbs, bool *steps, int cx, int cy, int length)
                    : DirectionalScanner (xmin, ymin, xmax, ymax,
                                          nbs, steps, cx, cy)
{
  this->dla = a;
  this->dlb = b;
  fs = steps + nbs;
  int w_2 = (length + 1) / 2;

  // Looking for the central scan start position
  bool *st = steps + nbs;
  for (int i = 0; i < w_2; i++)
  {
    if (--st < steps) st = steps + nbs - 1;
    if (*st) lcx ++;
    lcy --;
  }
  dlc1 = dla * lcx + dlb * lcy;
  lst2 = st;
  rst2 = st;

  // Looking for the upper leaning line
  st = steps;
  while (w_2-- > 0)
  {
    if (*st) cx--;
    cy++;
    if (++st >= fs) st = steps;
  }
  dlc2 = dla * cx + dlb * cy;

  this->templ_a = a;
  this->templ_b = b;
  this->templ_nu = this->dlc1 - this->dlc2;

  rcx = lcx;
  rcy = lcy;
}